

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

OptionBase<Kernel::SelectedLiteral> * __thiscall
Lib::OptionBase<Kernel::SelectedLiteral>::operator=
          (OptionBase<Kernel::SelectedLiteral> *this,OptionBase<Kernel::SelectedLiteral> *other)

{
  bool bVar1;
  Clause *pCVar2;
  byte bVar3;
  undefined8 in_R8;
  undefined4 in_R10D;
  undefined4 in_R11D;
  
  if (other->_isSome == true) {
    bVar1 = (other->_elem)._elem.init.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome;
    if (bVar1 == true) {
      bVar3 = *(byte *)&(other->_elem)._elem.init.interpreted.
                        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        ._elem._elem & 3;
      in_R11D = *(undefined4 *)((long)&(other->_elem)._elem + 0x11);
      in_R8 = *(undefined8 *)((long)&(other->_elem)._elem + 0x19);
      in_R10D = *(undefined4 *)((long)&(other->_elem)._elem + 0x21);
    }
    else {
      bVar3 = 0;
    }
    pCVar2 = (other->_elem)._elem.init.cl;
    (this->_elem)._elem.init.litIdx = (other->_elem)._elem.init.litIdx;
    (this->_elem)._elem.init.cl = pCVar2;
    (this->_elem)._elem.init.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._isSome = bVar1;
    if (bVar1 != false) {
      *(undefined8 *)((long)&(this->_elem)._elem + 0x10) = 0;
      *(undefined8 *)((long)&(this->_elem)._elem + 0x18) = 0;
      *(undefined8 *)((long)&(this->_elem)._elem + 0x1c) = 0;
      *(undefined8 *)((long)&(this->_elem)._elem + 0x24) = 0;
      *(byte *)&(this->_elem)._elem.init.interpreted.
                super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                ._elem._elem = bVar3;
      *(undefined4 *)((long)&(this->_elem)._elem + 0x11) = in_R11D;
      *(undefined8 *)((long)&(this->_elem)._elem + 0x19) = in_R8;
      *(undefined4 *)((long)&(this->_elem)._elem + 0x21) = in_R10D;
    }
  }
  this->_isSome = other->_isSome;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }